

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameter.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
ezc3d::ParametersNS::GroupNS::Parameter::valuesAsInt(Parameter *this)

{
  invalid_argument *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  if ((this->_isEmpty == false) && (1 < (uint)(this->_data_type + CHAR))) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(&bStack_38,&this->_name," parameter is not an INT");
    std::invalid_argument::invalid_argument(this_00,(string *)&bStack_38);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return &this->_param_data_int;
}

Assistant:

const std::vector<int> &
ezc3d::ParametersNS::GroupNS::Parameter::valuesAsInt() const {
  if (!_isEmpty && _data_type != DATA_TYPE::INT &&
      _data_type != DATA_TYPE::BYTE)
    throw std::invalid_argument(_name + " parameter is not an INT");
  return _param_data_int;
}